

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

void test_archive_string_normalization_nfc(char *testdata)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  archive_conflict *a_00;
  archive_string_conv *sc;
  archive_string_conv *sc_00;
  archive_string_conv *sc_01;
  archive_conflict *a_01;
  archive_string_conv *sc_02;
  char *pcVar5;
  size_t sVar6;
  size_t local_6c0;
  size_t mplen;
  char *mp;
  wchar_t *wp;
  char *p;
  char *e;
  wchar_t wc_nfd [40];
  wchar_t wc_nfc [40];
  char utf16le_nfd [80];
  char utf16le_nfc [80];
  char utf16be_nfd [80];
  char utf16be_nfc [80];
  char utf8_nfd [80];
  char utf8_nfc [80];
  char nfd [80];
  char nfc [80];
  wchar_t sconv_opt;
  wchar_t wc_is_unicode;
  wchar_t locale_is_utf8;
  wchar_t line;
  char buff [512];
  FILE_conflict *fp;
  archive_string_conv *f_sconv16le;
  archive_string_conv *f_sconv16be;
  archive_string_conv *t_sconv8;
  archive_string_conv *f_sconv8;
  archive_mstring mstr;
  archive_string utf8;
  archive *a2;
  archive *a;
  char *testdata_local;
  
  wc_is_unicode = L'\0';
  pcVar4 = setlocale(6,"en_US.UTF-8");
  wVar1 = is_wc_unicode();
  if ((pcVar4 != (char *)0x0) || (wVar1 != L'\0')) {
    mstr.aes_set = L'\0';
    mstr._100_4_ = 0;
    memset(&f_sconv8,0,0x68);
    a_00 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ė',(uint)(a_00 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    sc = archive_string_conversion_from_charset(a_00,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ę',(uint)(sc != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     a_00);
    sc_00 = archive_string_conversion_from_charset(a_00,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ě',(uint)(sc_00 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,a_00);
    sc_01 = archive_string_conversion_from_charset(a_00,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ĝ',(uint)(sc_01 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,a_00);
    a_01 = (archive_conflict *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ğ',(uint)(a_01 != (archive_conflict *)0x0),
                     "(a2 = archive_write_new()) != NULL",(void *)0x0);
    sc_02 = archive_string_conversion_to_charset(a_01,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ġ',(uint)(sc_02 != (archive_string_conv *)0x0),
                     "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))",
                     a_00);
    if ((sc == (archive_string_conv *)0x0) ||
       (((sc_00 == (archive_string_conv *)0x0 || (sc_01 == (archive_string_conv *)0x0)) ||
        (sc_02 == (archive_string_conv *)0x0)))) {
      iVar2 = archive_read_free((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'Ĥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    }
    else {
      archive_string_conversion_set_opt(sc,L'\x02');
      archive_string_conversion_set_opt(sc_00,L'\x02');
      archive_string_conversion_set_opt(sc_01,L'\x02');
      archive_string_conversion_set_opt(sc_02,L'\x02');
      buff._504_8_ = fopen(testdata,"r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ĭ',(uint)((FILE *)buff._504_8_ != (FILE *)0x0),
                       "(fp = fopen(testdata, \"r\")) != NULL",(void *)0x0);
LAB_0013675c:
      pcVar5 = fgets((char *)&locale_is_utf8,0x200,(FILE *)buff._504_8_);
      if (pcVar5 != (char *)0x0) {
        wc_is_unicode = wc_is_unicode + L'\x01';
        if ((char)locale_is_utf8 != '#') {
          pcVar5 = strchr((char *)&locale_is_utf8,0x3b);
          if (pcVar5 == (char *)0x0) {
            wp = (wchar_t *)0x0;
            goto LAB_0013675c;
          }
          wp = (wchar_t *)(pcVar5 + 1);
          *pcVar5 = '\0';
          strncpy(nfd + 0x48,(char *)&locale_is_utf8,0x4f);
          p = (char *)wp;
          wp = (wchar_t *)strchr((char *)wp,10);
          if (wp != (wchar_t *)0x0) {
            *(char *)wp = '\0';
            strncpy(utf8_nfc + 0x48,p,0x4f);
            nfd[0x47] = '\0';
            scan_unicode_pattern
                      (utf8_nfd + 0x48,wc_nfd + 0x26,utf16be_nfd + 0x48,utf16le_nfd + 0x48,
                       nfd + 0x48,L'\0');
            scan_unicode_pattern
                      (utf16be_nfc + 0x48,(wchar_t *)&e,utf16le_nfc + 0x48,(char *)(wc_nfc + 0x26),
                       utf8_nfc + 0x48,L'\0');
            if (pcVar4 != (char *)0x0) {
              sVar6 = strlen(utf16be_nfc + 0x48);
              wVar3 = archive_strncpy_l((archive_string *)&mstr.aes_set,utf16be_nfc + 0x48,sVar6,sc)
              ;
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ť',0,"0",(long)wVar3,
                                  "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48,
                      (ulong)(uint)wc_is_unicode);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ũ',utf8_nfd + 0x48,"utf8_nfc",(char *)mstr._96_8_,"utf8.s",(void *)0x0,
                         L'\x01');
              sVar6 = strlen(utf8_nfd + 0x48);
              wVar3 = archive_strncpy_l((archive_string *)&mstr.aes_set,utf8_nfd + 0x48,sVar6,sc);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ů',0,"0",(long)wVar3,
                                  "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfd + 0x48,(ulong)(uint)wc_is_unicode);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ű',utf8_nfd + 0x48,"utf8_nfc",(char *)mstr._96_8_,"utf8.s",(void *)0x0,
                         L'\x01');
              sVar6 = strlen(utf8_nfd + 0x48);
              wVar3 = archive_strncpy_l((archive_string *)&mstr.aes_set,utf8_nfd + 0x48,sVar6,sc_02)
              ;
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ŷ',0,"0",(long)wVar3,
                                  "archive_strcpy_l( &utf8, utf8_nfc, t_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfd + 0x48,(ulong)(uint)wc_is_unicode);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ź',utf8_nfd + 0x48,"utf8_nfc",(char *)mstr._96_8_,"utf8.s",(void *)0x0,
                         L'\x01');
              wVar3 = archive_strncpy_l((archive_string *)&mstr.aes_set,utf16le_nfc + 0x48,100000,
                                        sc_00);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƀ',0,"0",(long)wVar3,
                                  "archive_strncpy_l( &utf8, utf16be_nfd, 100000, f_sconv16be)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48,
                      (ulong)(uint)wc_is_unicode);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƃ',utf8_nfd + 0x48,"utf8_nfc",(char *)mstr._96_8_,"utf8.s",(void *)0x0,
                         L'\x01');
              wVar3 = archive_strncpy_l((archive_string *)&mstr.aes_set,wc_nfc + 0x26,100000,sc_01);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɖ',0,"0",(long)wVar3,
                                  "archive_strncpy_l( &utf8, utf16le_nfd, 100000, f_sconv16le)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48,
                      (ulong)(uint)wc_is_unicode);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƌ',utf8_nfd + 0x48,"utf8_nfc",(char *)mstr._96_8_,"utf8.s",(void *)0x0,
                         L'\x01');
            }
            else if (wVar1 == L'\0') goto LAB_0013675c;
            wVar3 = archive_mstring_copy_mbs_len_l
                              ((archive_mstring *)&f_sconv8,utf16be_nfc + 0x48,100000,sc);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'ƛ',0,"0",(long)wVar3,
                                "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfd, 100000, f_sconv8)"
                                ,(void *)0x0);
            wVar3 = archive_mstring_get_wcs(a_00,(archive_mstring *)&f_sconv8,(wchar_t **)&mp);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'Ɲ',0,"0",(long)wVar3,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                (void *)0x0);
            failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48
                    ,(ulong)(uint)wc_is_unicode);
            assertion_equal_wstring
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'Ơ',wc_nfd + 0x26,"wc_nfc",(wchar_t *)mp,"wp",(void *)0x0);
            wVar3 = archive_mstring_copy_mbs_len_l
                              ((archive_mstring *)&f_sconv8,utf16le_nfc + 0x48,100000,sc_00);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'Ʀ',0,"0",(long)wVar3,
                                "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)"
                                ,(void *)0x0);
            wVar3 = archive_mstring_get_wcs(a_00,(archive_mstring *)&f_sconv8,(wchar_t **)&mp);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'ƨ',0,"0",(long)wVar3,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                (void *)0x0);
            failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48
                    ,(ulong)(uint)wc_is_unicode);
            assertion_equal_wstring
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ƫ',wc_nfd + 0x26,"wc_nfc",(wchar_t *)mp,"wp",(void *)0x0);
            wVar3 = archive_mstring_copy_mbs_len_l
                              ((archive_mstring *)&f_sconv8,(char *)(wc_nfc + 0x26),100000,sc_01);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'Ʊ',0,"0",(long)wVar3,
                                "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfd, 100000, f_sconv16le)"
                                ,(void *)0x0);
            wVar3 = archive_mstring_get_wcs(a_00,(archive_mstring *)&f_sconv8,(wchar_t **)&mp);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'Ƴ',0,"0",(long)wVar3,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                (void *)0x0);
            failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",utf8_nfc + 0x48,nfd + 0x48
                    ,(ulong)(uint)wc_is_unicode);
            assertion_equal_wstring
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ƶ',wc_nfd + 0x26,"wc_nfc",(wchar_t *)mp,"wp",(void *)0x0);
            wVar3 = archive_mstring_copy_wcs((archive_mstring *)&f_sconv8,wc_nfd + 0x26);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'Ƽ',0,"0",(long)wVar3,"archive_mstring_copy_wcs(&mstr, wc_nfc)",
                                (void *)0x0);
            wVar3 = archive_mstring_get_mbs_l
                              (a_00,(archive_mstring *)&f_sconv8,(char **)&mplen,&local_6c0,sc_02);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                ,L'ƾ',0,"0",(long)wVar3,
                                "archive_mstring_get_mbs_l( a, &mstr, &mp, &mplen, t_sconv8)",
                                (void *)0x0);
            failure("WCS NFC(%s) should be UTF-8 NFC:%d",nfd + 0x48,(ulong)(uint)wc_is_unicode);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ǁ',utf8_nfd + 0x48,"utf8_nfc",(char *)mplen,"mp",(void *)0x0,L'\x01');
          }
        }
        goto LAB_0013675c;
      }
      archive_string_free((archive_string *)&mstr.aes_set);
      archive_mstring_clean((archive_mstring *)&f_sconv8);
      fclose((FILE *)buff._504_8_);
      iVar2 = archive_read_free((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'ǈ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
      iVar2 = archive_write_free((archive *)a_01);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'ǉ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a2)",(void *)0x0);
    }
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ċ');
    test_skipping(
                 "A test of string normalization for NFC requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  return;
}

Assistant:

static void
test_archive_string_normalization_nfc(const char *testdata)
{
	struct archive *a, *a2;
	struct archive_string utf8;
	struct archive_mstring mstr;
	struct archive_string_conv *f_sconv8, *t_sconv8;
	struct archive_string_conv *f_sconv16be, *f_sconv16le;
	FILE *fp;
	char buff[512];
	int line = 0;
	int locale_is_utf8, wc_is_unicode;
	int sconv_opt = SCONV_SET_OPT_NORMALIZATION_C;

	locale_is_utf8 = (NULL != setlocale(LC_ALL, "en_US.UTF-8"));
	wc_is_unicode = is_wc_unicode();
	/* If it doesn't exist, just warn and return. */
	if (!locale_is_utf8 && !wc_is_unicode) {
		skipping("A test of string normalization for NFC requires "
		    "a suitable locale; en_US.UTF-8 not available on this "
		    "system");
		return;
	}

	archive_string_init(&utf8);
	memset(&mstr, 0, sizeof(mstr));

	/*
	 * Create string conversion objects.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(NULL != (f_sconv8 =
	    archive_string_conversion_from_charset(a, "UTF-8", 0)));
	assertA(NULL != (f_sconv16be =
	    archive_string_conversion_from_charset(a, "UTF-16BE", 0)));
	assertA(NULL != (f_sconv16le =
	    archive_string_conversion_from_charset(a, "UTF-16LE", 0)));
	assert((a2 = archive_write_new()) != NULL);
	assertA(NULL != (t_sconv8 =
	    archive_string_conversion_to_charset(a2, "UTF-8", 0)));
	if (f_sconv8 == NULL || f_sconv16be == NULL || f_sconv16le == NULL ||
	    t_sconv8 == NULL) {
		/* We cannot continue this test. */
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	archive_string_conversion_set_opt(f_sconv8, sconv_opt);
	archive_string_conversion_set_opt(f_sconv16be, sconv_opt);
	archive_string_conversion_set_opt(f_sconv16le, sconv_opt);
	archive_string_conversion_set_opt(t_sconv8, sconv_opt);

	/* Open a test pattern file. */
	assert((fp = fopen(testdata, "r")) != NULL);

	/*
	 * Read test data.
	 *  Test data format:
	 *     <NFC Unicode pattern> ';' <NFD Unicode pattern> '\n'
	 *  Unicode pattern format:
	 *     [0-9A-F]{4,5}([ ][0-9A-F]{4,5}){0,}
	 */
	while (fgets(buff, sizeof(buff), fp) != NULL) {
		char nfc[80], nfd[80];
		char utf8_nfc[80], utf8_nfd[80];
		char utf16be_nfc[80], utf16be_nfd[80];
		char utf16le_nfc[80], utf16le_nfd[80];
		wchar_t wc_nfc[40], wc_nfd[40];
		char *e, *p;
		const wchar_t *wp;
		const char *mp;
		size_t mplen;

		line++;
		if (buff[0] == '#')
			continue;
		p = strchr(buff, ';');
		if (p == NULL)
			continue;
		*p++ = '\0';
		/* Copy an NFC pattern */
		strncpy(nfc, buff, sizeof(nfc)-1);
		nfc[sizeof(nfc)-1] = '\0';
		e = p;
		p = strchr(p, '\n');
		if (p == NULL)
			continue;
		*p = '\0';
		/* Copy an NFD pattern */
		strncpy(nfd, e, sizeof(nfd)-1);
		nfd[sizeof(nfd)-1] = '\0';

		/*
		 * Get an NFC patterns.
		 */
		scan_unicode_pattern(utf8_nfc, wc_nfc, utf16be_nfc, utf16le_nfc,
		    nfc, 0);

		/*
		 * Get an NFD patterns.
		 */
		scan_unicode_pattern(utf8_nfd, wc_nfd, utf16be_nfd, utf16le_nfd,
		    nfd, 0);

		if (locale_is_utf8) {
			/*
			 * Normalize an NFD string for import.
			 */
			assertEqualInt(0, archive_strcpy_l(
			    &utf8, utf8_nfd, f_sconv8));
			failure("NFD(%s) should be converted to NFC(%s):%d",
			    nfd, nfc, line);
			assertEqualUTF8String(utf8_nfc, utf8.s);

			/*
			 * Normalize an NFC string for import.
			 */
			assertEqualInt(0, archive_strcpy_l(
			    &utf8, utf8_nfc, f_sconv8));
			failure("NFC(%s) should not be any changed:%d",
			    nfc, line);
			assertEqualUTF8String(utf8_nfc, utf8.s);

			/*
			 * Copy an NFC string for export.
			 */
			assertEqualInt(0, archive_strcpy_l(
			    &utf8, utf8_nfc, t_sconv8));
			failure("NFC(%s) should not be any changed:%d",
			    nfc, line);
			assertEqualUTF8String(utf8_nfc, utf8.s);

			/*
			 * Normalize an NFD string in UTF-16BE for import.
			 */
			assertEqualInt(0, archive_strncpy_l(
			    &utf8, utf16be_nfd, 100000, f_sconv16be));
			failure("NFD(%s) should be converted to NFC(%s):%d",
			    nfd, nfc, line);
			assertEqualUTF8String(utf8_nfc, utf8.s);

			/*
			 * Normalize an NFD string in UTF-16LE for import.
			 */
			assertEqualInt(0, archive_strncpy_l(
			    &utf8, utf16le_nfd, 100000, f_sconv16le));
			failure("NFD(%s) should be converted to NFC(%s):%d",
			    nfd, nfc, line);
			assertEqualUTF8String(utf8_nfc, utf8.s);
		}

		/*
		 * Test for archive_mstring interface.
		 * In specific, Windows platform UTF-16BE is directly
		 * converted to/from wide-character to avoid the effect of
		 * current locale since windows platform cannot make
		 * locale UTF-8.
		 */
		if (locale_is_utf8 || wc_is_unicode) {
			/*
			 * Normalize an NFD string in UTF-8 for import.
			 */
			assertEqualInt(0, archive_mstring_copy_mbs_len_l(
			    &mstr, utf8_nfd, 100000, f_sconv8));
			assertEqualInt(0,
			    archive_mstring_get_wcs(a, &mstr, &wp));
			failure("UTF-8 NFD(%s) should be converted "
			    "to WCS NFC(%s):%d", nfd, nfc, line);
			assertEqualWString(wc_nfc, wp);

			/*
			 * Normalize an NFD string in UTF-16BE for import.
			 */
			assertEqualInt(0, archive_mstring_copy_mbs_len_l(
			    &mstr, utf16be_nfd, 100000, f_sconv16be));
			assertEqualInt(0,
			    archive_mstring_get_wcs(a, &mstr, &wp));
			failure("UTF-8 NFD(%s) should be converted "
			    "to WCS NFC(%s):%d", nfd, nfc, line);
			assertEqualWString(wc_nfc, wp);

			/*
			 * Normalize an NFD string in UTF-16LE for import.
			 */
			assertEqualInt(0, archive_mstring_copy_mbs_len_l(
			    &mstr, utf16le_nfd, 100000, f_sconv16le));
			assertEqualInt(0,
			    archive_mstring_get_wcs(a, &mstr, &wp));
			failure("UTF-8 NFD(%s) should be converted "
			    "to WCS NFC(%s):%d", nfd, nfc, line);
			assertEqualWString(wc_nfc, wp);

			/*
			 * Copy an NFC wide-string for export.
			 */
			assertEqualInt(0,
			    archive_mstring_copy_wcs(&mstr, wc_nfc));
			assertEqualInt(0, archive_mstring_get_mbs_l(
			    a, &mstr, &mp, &mplen, t_sconv8));
			failure("WCS NFC(%s) should be UTF-8 NFC:%d"
			    ,nfc, line);
			assertEqualUTF8String(utf8_nfc, mp);
		}
	}

	archive_string_free(&utf8);
	archive_mstring_clean(&mstr);
	fclose(fp);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a2));
}